

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

int ma_strcpy_s(char *dst,size_t dstSizeInBytes,char *src)

{
  int iVar1;
  size_t sVar2;
  
  if (dst == (char *)0x0) {
    return 0x16;
  }
  if (dstSizeInBytes == 0) {
    return 0x22;
  }
  if (src == (char *)0x0) {
    iVar1 = 0x16;
  }
  else {
    sVar2 = 0;
    do {
      if (src[sVar2] == '\0') {
        dst = dst + sVar2;
        iVar1 = 0;
        goto LAB_00155429;
      }
      dst[sVar2] = src[sVar2];
      sVar2 = sVar2 + 1;
    } while (dstSizeInBytes != sVar2);
    iVar1 = 0x22;
  }
LAB_00155429:
  *dst = '\0';
  return iVar1;
}

Assistant:

MA_API MA_NO_INLINE int ma_strcpy_s(char* dst, size_t dstSizeInBytes, const char* src)
{
    size_t i;

    if (dst == 0) {
        return 22;
    }
    if (dstSizeInBytes == 0) {
        return 34;
    }
    if (src == 0) {
        dst[0] = '\0';
        return 22;
    }

    for (i = 0; i < dstSizeInBytes && src[i] != '\0'; ++i) {
        dst[i] = src[i];
    }

    if (i < dstSizeInBytes) {
        dst[i] = '\0';
        return 0;
    }

    dst[0] = '\0';
    return 34;
}